

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O0

cio_bs_state internal_read_at_least(cio_buffered_stream *buffered_stream)

{
  cio_read_buffer *read_buffer_00;
  size_t sVar1;
  size_t available;
  cio_read_buffer *read_buffer;
  cio_buffered_stream *buffered_stream_local;
  
  read_buffer_00 = buffered_stream->read_buffer;
  if (buffered_stream->last_error == CIO_SUCCESS) {
    sVar1 = cio_read_buffer_unread_bytes(read_buffer_00);
    if (sVar1 < (buffered_stream->read_info).bytes_to_read) {
      buffered_stream_local._4_4_ = CIO_BS_AGAIN;
    }
    else {
      buffered_stream_local._4_4_ =
           call_handler(buffered_stream,CIO_SUCCESS,read_buffer_00,
                        (buffered_stream->read_info).bytes_to_read);
    }
  }
  else {
    buffered_stream_local._4_4_ =
         call_handler(buffered_stream,buffered_stream->last_error,read_buffer_00,0);
  }
  return buffered_stream_local._4_4_;
}

Assistant:

static enum cio_bs_state internal_read_at_least(struct cio_buffered_stream *buffered_stream)
{
	struct cio_read_buffer *read_buffer = buffered_stream->read_buffer;

	if (cio_unlikely(buffered_stream->last_error != CIO_SUCCESS)) {
		return call_handler(buffered_stream, buffered_stream->last_error, read_buffer, 0);
	}

	size_t available = cio_read_buffer_unread_bytes(read_buffer);
	if (buffered_stream->read_info.bytes_to_read <= available) {
		return call_handler(buffered_stream, CIO_SUCCESS, read_buffer, buffered_stream->read_info.bytes_to_read);
	}

	return CIO_BS_AGAIN;
}